

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthPermute(uint *pOut,uint *pIn,int nVars,char *pPerm,int fReturnIn)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint *pOut_00;
  
  iVar8 = 1;
  if (1 < nVars) {
    iVar8 = nVars;
  }
  uVar7 = 0;
  uVar6 = 0;
  bVar3 = true;
  while( true ) {
    while (pOut_00 = pOut, bVar4 = bVar3, uVar5 = uVar6, pOut = pOut_00, iVar8 - 1 == uVar5) {
      uVar6 = 0;
      bVar3 = true;
      if (bVar4) {
        if ((uVar7 & 1 ^ fReturnIn) != 1) {
          Kit_TruthCopy(pOut_00,pIn,nVars);
          return;
        }
        return;
      }
    }
    cVar1 = pPerm[uVar5];
    cVar2 = pPerm[uVar5 + 1];
    if (cVar1 == cVar2) break;
    uVar6 = uVar5 + 1;
    bVar3 = bVar4;
    if (cVar2 < cVar1) {
      uVar7 = uVar7 + 1;
      pPerm[uVar5] = cVar2;
      pPerm[uVar6] = cVar1;
      Kit_TruthSwapAdjacentVars(pOut_00,pIn,nVars,(int)uVar5);
      bVar3 = false;
      pOut = pIn;
      pIn = pOut_00;
    }
  }
  __assert_fail("pPerm[i] != pPerm[i+1]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                ,0xf1,"void Kit_TruthPermute(unsigned int *, unsigned int *, int, char *, int)");
}

Assistant:

void Kit_TruthPermute( unsigned * pOut, unsigned * pIn, int nVars, char * pPerm, int fReturnIn )
{
    unsigned * pTemp;
    int i, Temp, fChange, Counter = 0;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            assert( pPerm[i] != pPerm[i+1] );
            if ( pPerm[i] <= pPerm[i+1] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pPerm[i];
            pPerm[i] = pPerm[i+1];
            pPerm[i+1] = Temp;

            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    if ( fReturnIn ^ !(Counter & 1) )
        Kit_TruthCopy( pOut, pIn, nVars );
}